

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall ghc::filesystem::path::postprocess_path_with_format(path *this,format fmt)

{
  ulong uVar1;
  char *pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  undefined8 local_a0;
  undefined8 local_98 [2];
  undefined8 local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  iterator new_end_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined8 local_58;
  undefined8 local_50 [2];
  undefined8 local_40;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator new_end;
  format fmt_local;
  path *this_local;
  
  new_end._M_current._4_4_ = fmt;
  uVar1 = std::__cxx11::string::length();
  if ((((uVar1 < 3) ||
       (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 != '/')) ||
      (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 != '/')) ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this), *pcVar2 == '/')) {
    local_80._M_current = (char *)std::__cxx11::string::begin();
    local_78 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_80,0);
    local_88 = std::__cxx11::string::end();
    local_70 = std::
               unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::__1>
                         (local_78,local_88);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_98,&local_70);
    local_a8._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_a0,&local_a8);
    std::__cxx11::string::erase(this,local_98[0],local_a0);
  }
  else {
    local_38._M_current = (char *)std::__cxx11::string::begin();
    local_30 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_38,0);
    local_28 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_30,2);
    local_40 = std::__cxx11::string::end();
    local_20 = std::
               unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::__0>
                         (local_28,local_40);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)local_50,&local_20);
    local_60._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
    std::__cxx11::string::erase(this,local_50[0],local_58);
  }
  return;
}

Assistant:

GHC_INLINE void path::postprocess_path_with_format(path::format fmt)
{
#ifdef GHC_RAISE_UNICODE_ERRORS
    if (!detail::validUtf8(_path)) {
        path t;
        t._path = _path;
        throw filesystem_error("Illegal byte sequence for unicode character.", t, std::make_error_code(std::errc::illegal_byte_sequence));
    }
#endif
    switch (fmt) {
#ifdef GHC_OS_WINDOWS
        case path::native_format:
        case path::auto_format:
        case path::generic_format:
            for (auto& c : _path) {
                if (c == generic_separator) {
                    c = preferred_separator;
                }
            }
#ifdef GHC_WIN_AUTO_PREFIX_LONG_PATH
            if (is_absolute() && _path.length() >= MAX_PATH - 12 && !detail::startsWith(_path, impl_string_type(GHC_PLATFORM_LITERAL("\\\\?\\")))) {
                _path = GHC_PLATFORM_LITERAL("\\\\?\\") + _path;
            }
#endif
            handle_prefixes();
            break;
#else
        case path::auto_format:
        case path::native_format:
        case path::generic_format:
            // nothing to do
            break;
#endif
    }
    if (_path.length() > _prefixLength + 2 && _path[_prefixLength] == preferred_separator && _path[_prefixLength + 1] == preferred_separator && _path[_prefixLength + 2] != preferred_separator) {
        impl_string_type::iterator new_end = std::unique(_path.begin() + static_cast<string_type::difference_type>(_prefixLength) + 2, _path.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == preferred_separator; });
        _path.erase(new_end, _path.end());
    }
    else {
        impl_string_type::iterator new_end = std::unique(_path.begin() + static_cast<string_type::difference_type>(_prefixLength), _path.end(), [](path::value_type lhs, path::value_type rhs) { return lhs == rhs && lhs == preferred_separator; });
        _path.erase(new_end, _path.end());
    }
}